

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O0

unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
 tonk::
 MakeUniqueNoThrow<asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>,asio::io_context&>
           (io_context *args)

{
  void *pvVar1;
  io_context *in_RDI;
  _Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
  this;
  
  this._M_head_impl =
       (basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_> *)in_RDI;
  pvVar1 = operator_new(0x18,(nothrow_t *)&std::nothrow);
  if (pvVar1 != (void *)0x0) {
    asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>::
    basic_resolver(this._M_head_impl,in_RDI);
  }
  std::
  unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>,std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>>>
  ::
  unique_ptr<std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>>,void>
            ((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
              *)this._M_head_impl,(pointer)in_RDI);
  return (__uniq_ptr_data<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>,_true,_true>
          )(tuple<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
            )this._M_head_impl;
}

Assistant:

inline std::unique_ptr<T> MakeUniqueNoThrow(Args&&... args) {
    return std::unique_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}